

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

wchar_t * __thiscall
fmt::v11::detail::allocator<wchar_t>::allocate(allocator<wchar_t> *this,size_t n)

{
  wchar_t *pwVar1;
  undefined8 *puVar2;
  
  pwVar1 = (wchar_t *)malloc(n * 4);
  if (pwVar1 != (wchar_t *)0x0) {
    return pwVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = clock_gettime;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

T* allocate(size_t n) {
    FMT_ASSERT(n <= max_value<size_t>() / sizeof(T), "");
    T* p = static_cast<T*>(malloc(n * sizeof(T)));
    if (!p) FMT_THROW(std::bad_alloc());
    return p;
  }